

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,Message *value)

{
  int iVar1;
  int iVar2;
  Arena *my_arena;
  Rep *pRVar3;
  Arena *pAVar4;
  
  pAVar4 = (Arena *)GenericTypeHandler<google::protobuf::Message>::GetMaybeArenaPointer(value);
  my_arena = this->arena_;
  if ((my_arena == pAVar4) && (pRVar3 = this->rep_, pRVar3 != (Rep *)0x0)) {
    iVar1 = pRVar3->allocated_size;
    if (iVar1 < this->total_size_) {
      iVar2 = this->current_size_;
      if (iVar2 < iVar1) {
        pRVar3->elements[iVar1] = pRVar3->elements[iVar2];
      }
      pRVar3->elements[iVar2] = value;
      this->current_size_ = iVar2 + 1;
      this->rep_->allocated_size = this->rep_->allocated_size + 1;
      return;
    }
  }
  pAVar4 = GenericTypeHandler<google::protobuf::Message>::GetArena(value);
  AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (this,value,pAVar4,my_arena);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedInternal(
    typename TypeHandler::Type* value,
    google::protobuf::internal::true_type) {
  Arena* element_arena = reinterpret_cast<Arena*>(
      TypeHandler::GetMaybeArenaPointer(value));
  Arena* arena = GetArenaNoVirtual();
  if (arena == element_arena && rep_ &&
      rep_->allocated_size < total_size_) {
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at least
    // one slot that is not allocated).
    void** elems = rep_->elements;
    if (current_size_ < rep_->allocated_size) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[rep_->allocated_size] = elems[current_size_];
    }
    elems[current_size_] = value;
    current_size_ = current_size_ + 1;
    rep_->allocated_size = rep_->allocated_size + 1;
    return;
  } else {
    AddAllocatedSlowWithCopy<TypeHandler>(
        value, TypeHandler::GetArena(value), arena);
  }
}